

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbtree.c
# Opt level: O0

void insert_recolour(opr_rbtree *head,opr_rbtree_node *node)

{
  opr_rbtree_node *node_00;
  opr_rbtree_node *poVar1;
  bool bVar2;
  opr_rbtree_node *uncle_1;
  opr_rbtree_node *uncle;
  opr_rbtree_node *gramps;
  opr_rbtree_node *parent;
  opr_rbtree_node *node_local;
  opr_rbtree *head_local;
  
  parent = node;
  node_local = (opr_rbtree_node *)head;
  while( true ) {
    gramps = parent->parent;
    bVar2 = false;
    if (gramps != (opr_rbtree_node *)0x0) {
      bVar2 = gramps->red != 0;
    }
    if (!bVar2) break;
    node_00 = gramps->parent;
    if (gramps == node_00->left) {
      poVar1 = node_00->right;
      if ((poVar1 == (opr_rbtree_node *)0x0) || (poVar1->red == 0)) {
        if (gramps->right == parent) {
          rotateleft((opr_rbtree *)node_local,gramps);
          swapnode(&gramps,&parent);
        }
        gramps->red = 0;
        node_00->red = 1;
        rotateright((opr_rbtree *)node_local,node_00);
      }
      else {
        poVar1->red = 0;
        gramps->red = 0;
        node_00->red = 1;
        parent = node_00;
      }
    }
    else {
      poVar1 = node_00->left;
      if ((poVar1 == (opr_rbtree_node *)0x0) || (poVar1->red == 0)) {
        if (gramps->left == parent) {
          rotateright((opr_rbtree *)node_local,gramps);
          swapnode(&gramps,&parent);
        }
        gramps->red = 0;
        node_00->red = 1;
        rotateleft((opr_rbtree *)node_local,node_00);
      }
      else {
        poVar1->red = 0;
        gramps->red = 0;
        node_00->red = 1;
        parent = node_00;
      }
    }
  }
  node_local->left->red = 0;
  return;
}

Assistant:

static void insert_recolour(struct opr_rbtree *head,
			    struct opr_rbtree_node *node)
{
	struct opr_rbtree_node *parent, *gramps;

	while ((parent = node->parent) && parent->red) {
		gramps = parent->parent;

		if (parent == gramps->left) {
			struct opr_rbtree_node *uncle = gramps->right;

			if (uncle && uncle->red) {
				uncle->red = 0;
				parent->red = 0;
				gramps->red = 1;
				node = gramps;
				continue;
			}

			if (parent->right == node) {
				rotateleft(head, parent);
				swapnode(&parent, &node);
			}

			parent->red = 0;
			gramps->red = 1;
			rotateright(head, gramps);
		} else {
			struct opr_rbtree_node *uncle = gramps->left;

			if (uncle && uncle->red) {
				uncle->red = 0;
				parent->red = 0;
				gramps->red = 1;
				node = gramps;
				continue;
			}

			if (parent->left == node) {
				rotateright(head, parent);
				swapnode(&parent, &node);
			}

			parent->red = 0;
			gramps->red = 1;
			rotateleft(head, gramps);
		}
	}

	head->root->red = 0;
}